

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void wasm::destroyAllTypesForTestingPurposesOnly(void)

{
  anon_unknown_0::TupleStore::clear((TupleStore *)(anonymous_namespace)::globalTupleStore);
  std::
  vector<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>,_std::allocator<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>_>_>
  ::clear((vector<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>,_std::allocator<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>_>_>
           *)(anonymous_namespace)::globalHeapTypeStore);
  anon_unknown_0::RecGroupStore::clear((RecGroupStore *)(anonymous_namespace)::globalRecGroupStore);
  return;
}

Assistant:

void destroyAllTypesForTestingPurposesOnly() {
  globalTupleStore.clear();
  globalHeapTypeStore.clear();
  globalRecGroupStore.clear();
}